

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
          (TPZMultiphysicsCompMesh *this,TPZVec<TPZCompMesh_*> *mesh_vector,TPZVec<long> *gelindexes
          )

{
  long lVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  undefined1 local_80 [16];
  ulong uStack_70;
  ulong local_68;
  TPZCompMesh *local_60 [7];
  
  stack0xffffffffffffff88 = (undefined1  [16])0x0;
  local_68 = 0;
  local_80._0_8_ = &PTR__TPZManVector_01925ab8;
  uVar6 = mesh_vector->fNElements;
  if ((long)uVar6 < 8) {
    uStack_70 = uVar6;
    local_80._8_8_ = local_60;
    if ((long)uVar6 < 1) goto LAB_0114d1bb;
  }
  else {
    local_80._8_8_ = operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
    uStack_70 = uVar6;
    local_68 = uVar6;
  }
  uVar4 = 0;
  do {
    *(TPZCompMesh **)(local_80._8_8_ + uVar4 * 8) = mesh_vector->fStore[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar6 != uVar4);
LAB_0114d1bb:
  TPZManVector<TPZCompMesh_*,_7>::operator=
            (&this->m_mesh_vector,(TPZManVector<TPZCompMesh_*,_7> *)local_80);
  if ((TPZCompMesh **)local_80._8_8_ != local_60) {
    local_68 = 0;
    local_80._0_8_ = &PTR__TPZVec_018144b0;
    if ((TPZCompMesh **)local_80._8_8_ != (TPZCompMesh **)0x0) {
      operator_delete__((void *)local_80._8_8_);
    }
  }
  TPZManVector<int,_5>::Resize
            (&this->m_active_approx_spaces,
             (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNElements);
  auVar3 = _DAT_014d28c0;
  lVar1 = (this->m_active_approx_spaces).super_TPZVec<int>.fNElements;
  if (0 < lVar1) {
    piVar2 = (this->m_active_approx_spaces).super_TPZVec<int>.fStore;
    lVar5 = lVar1 + -1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_014d28c0;
    auVar9 = _DAT_014d2b10;
    auVar10 = _DAT_014d28b0;
    do {
      auVar11 = auVar10 ^ auVar3;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar8 && auVar7._0_4_ < auVar11._0_4_ || iVar8 < auVar11._4_4_)
                & 1)) {
        piVar2[uVar6] = 1;
      }
      if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
          auVar11._12_4_ <= auVar7._12_4_) {
        piVar2[uVar6 + 1] = 1;
      }
      auVar11 = auVar9 ^ auVar3;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar8 && (iVar12 != iVar8 || auVar11._0_4_ <= auVar7._0_4_)) {
        piVar2[uVar6 + 2] = 1;
        piVar2[uVar6 + 3] = 1;
      }
      uVar6 = uVar6 + 4;
      lVar5 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar5 + 4;
      lVar5 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar5 + 4;
    } while ((lVar1 + 3U & 0xfffffffffffffffc) != uVar6);
  }
  (this->super_TPZCompMesh).fNmeshes =
       (long)(int)(this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNElements;
  TPZGeoMesh::ResetReference((this->super_TPZCompMesh).fReference);
  CleanElementsConnects(this);
  TPZCreateApproximationSpace::BuildMesh
            (&(this->super_TPZCompMesh).fCreate,&this->super_TPZCompMesh,gelindexes);
  AddElements(this);
  AddConnects(this);
  LoadSolutionFromMeshes(this);
  return;
}

Assistant:

void TPZMultiphysicsCompMesh::BuildMultiphysicsSpace(TPZVec<TPZCompMesh * > & mesh_vector, const TPZVec<int64_t> &gelindexes){
    
    m_mesh_vector          = mesh_vector;
    m_active_approx_spaces.Resize(m_mesh_vector.size());
    for(int64_t i = 0; i< m_active_approx_spaces.size(); i++) m_active_approx_spaces[i] = 1;
    int n_approx_spaces = m_mesh_vector.size();
    SetNMeshes(n_approx_spaces);
    Reference()->ResetReference();
    // if(ApproxSpace().Style() != TPZCreateApproximationSpace::EMultiphysics)
    // {
    //     std::cout << __PRETTY_FUNCTION__ << " Modifying the style of approximation space "
    //     " to multiphysics\n";
    //     SetAllCreateFunctionsMultiphysicElem();
    // }
    // delete all elements and connects in the mesh
    CleanElementsConnects();
    TPZCompMesh::AutoBuild(gelindexes);
    AddElements();
    AddConnects();
    LoadSolutionFromMeshes();
}